

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O2

char * unique_id(void *o,char *type,char *name,char *label)

{
  int iVar1;
  uint uVar2;
  id *piVar3;
  char c;
  uint uVar4;
  char *pcVar5;
  char *__s;
  id **ppiVar6;
  long lVar7;
  char buffer [128];
  
  pcVar5 = buffer;
  for (; *type != '\0'; type = type + 1) {
    *pcVar5 = *type;
    pcVar5 = pcVar5 + 1;
  }
  *pcVar5 = '_';
  if (((name != (char *)0x0) && (c = *name, c != '\0')) ||
     ((__s = pcVar5 + 1, label != (char *)0x0 && (c = *label, name = label, c != '\0')))) {
    while ((c != '\0' && (iVar1 = is_id(c), iVar1 == 0))) {
      c = name[1];
      name = name + 1;
    }
    lVar7 = 1;
    while (iVar1 = is_id(c), iVar1 != 0) {
      pcVar5[lVar7] = c;
      c = name[lVar7];
      lVar7 = lVar7 + 1;
    }
    __s = pcVar5 + lVar7;
  }
  *__s = '\0';
  uVar4 = 0;
  while( true ) {
    ppiVar6 = &id_root;
    while( true ) {
      piVar3 = *ppiVar6;
      if (piVar3 == (id *)0x0) {
        piVar3 = (id *)operator_new(0x20);
        id::id(piVar3,buffer,o);
        *ppiVar6 = piVar3;
        return piVar3->text;
      }
      pcVar5 = piVar3->text;
      uVar2 = strcmp(buffer,pcVar5);
      if (uVar2 == 0) break;
      ppiVar6 = &piVar3->left + (~uVar2 >> 0x1f);
    }
    if (piVar3->object == o) break;
    uVar4 = uVar4 + 1;
    sprintf(__s,"%x",(ulong)uVar4);
  }
  return pcVar5;
}

Assistant:

const char* unique_id(void* o, const char* type, const char* name, const char* label) {
  char buffer[128];
  char* q = buffer;
  while (*type) *q++ = *type++;
  *q++ = '_';
  const char* n = name;
  if (!n || !*n) n = label;
  if (n && *n) {
    while (*n && !is_id(*n)) n++;
    while (is_id(*n)) *q++ = *n++;
  }
  *q = 0;
  // okay, search the tree and see if the name was already used:
  id** p = &id_root;
  int which = 0;
  while (*p) {
    int i = strcmp(buffer, (*p)->text);
    if (!i) {
      if ((*p)->object == o) return (*p)->text;
      // already used, we need to pick a new name:
      sprintf(q,"%x",++which);
      p = &id_root;
      continue;
    }
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  *p = new id(buffer, o);
  return (*p)->text;
}